

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

void hwnet::http::HttpSession::onClose(Ptr *ss)

{
  any *paVar1;
  
  paVar1 = TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  std::
  function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
  ::operator=((function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
               *)(paVar1->content[1]._vptr_placeholder + 0x15),(nullptr_t)0x0);
  return;
}

Assistant:

void HttpSession::onClose(const TCPSocket::Ptr &ss) {
	auto session = any_cast<HttpSession*>(ss->GetUserData());
	session->onRequest = nullptr;
}